

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sticky.hpp
# Opt level: O0

void __thiscall OpenMD::Sticky::~Sticky(Sticky *this)

{
  Sticky *in_RDI;
  
  ~Sticky(in_RDI);
  operator_delete(in_RDI,0xd0);
  return;
}

Assistant:

void setForceField(ForceField* ff) { forceField_ = ff; }